

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O3

void __thiscall
doctest::anon_unknown_15::JUnitReporter::test_case_exception
          (JUnitReporter *this,TestCaseException *e)

{
  pointer *ppJVar1;
  pointer pJVar2;
  pointer __first;
  pthread_mutex_t *__mutex;
  int iVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  pointer __result;
  pointer pJVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__args_1;
  long lVar6;
  _Vector_base<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage,_std::allocator<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage>_>
  *this_00;
  allocator<char> local_81;
  pthread_mutex_t *local_80;
  _Alloc_hider local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  _Alloc_hider local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  iVar3 = pthread_mutex_lock((pthread_mutex_t *)&this->mutex);
  if (iVar3 != 0) {
    std::__throw_system_error(iVar3);
  }
  local_78._M_p = (pointer)&local_68;
  local_80 = (pthread_mutex_t *)&this->mutex;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"exception","");
  if ((e->error_string).field_0.buf[0x17] < '\0') {
    e = (TestCaseException *)(e->error_string).field_0.data.ptr;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,(char *)e,&local_81);
  pJVar2 = (this->testCaseData).testcases.
           super__Vector_base<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestCase,_std::allocator<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestCase>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pJVar5 = pJVar2[-1].errors.
           super__Vector_base<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage,_std::allocator<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_58._M_p = (pointer)this;
  if (pJVar5 == pJVar2[-1].errors.
                super__Vector_base<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage,_std::allocator<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    __first = pJVar2[-1].errors.
              super__Vector_base<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage,_std::allocator<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage>_>
              ._M_impl.super__Vector_impl_data._M_start;
    lVar6 = (long)pJVar5 - (long)__first;
    if (lVar6 == 0x7fffffffffffffe0) {
      std::__throw_length_error("vector::_M_realloc_insert");
    }
    __args_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((lVar6 >> 5) * -0x5555555555555555);
    pbVar4 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1;
    if (pJVar5 != __first) {
      pbVar4 = __args_1;
    }
    this_00 = (_Vector_base<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage,_std::allocator<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage>_>
               *)((long)pbVar4 + (long)__args_1);
    if ((_Vector_base<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage,_std::allocator<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage>_>
         *)0x155555555555554 < this_00) {
      this_00 = (_Vector_base<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage,_std::allocator<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage>_>
                 *)0x155555555555555;
    }
    if (CARRY8((ulong)pbVar4,(ulong)__args_1)) {
      this_00 = (_Vector_base<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage,_std::allocator<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage>_>
                 *)0x155555555555555;
    }
    __result = std::
               _Vector_base<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage,_std::allocator<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage>_>
               ::_M_allocate(this_00,(size_t)e);
    std::
    allocator_traits<std::allocator<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage>>
    ::
    construct<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage,std::__cxx11::string_const&,std::__cxx11::string_const&>
              ((allocator_type *)(lVar6 + (long)__result),(JUnitTestMessage *)&local_78,&local_50,
               __args_1);
    pJVar5 = std::
             vector<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage,_std::allocator<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage>_>
             ::_S_relocate(__first,pJVar5,__result,(_Tp_alloc_type *)__args_1);
    if (__first != (pointer)0x0) {
      operator_delete(__first,(long)pJVar2[-1].errors.
                                    super__Vector_base<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage,_std::allocator<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)__first);
    }
    pJVar2[-1].errors.
    super__Vector_base<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage,_std::allocator<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage>_>
    ._M_impl.super__Vector_impl_data._M_start = __result;
    pJVar2[-1].errors.
    super__Vector_base<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage,_std::allocator<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage>_>
    ._M_impl.super__Vector_impl_data._M_finish = pJVar5 + 1;
    pJVar2[-1].errors.
    super__Vector_base<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage,_std::allocator<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = __result + (long)this_00;
  }
  else {
    std::
    allocator_traits<std::allocator<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage>>
    ::
    construct<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage,std::__cxx11::string_const&,std::__cxx11::string_const&>
              ((allocator_type *)pJVar5,(JUnitTestMessage *)&local_78,&local_50,in_RCX);
    ppJVar1 = &pJVar2[-1].errors.
               super__Vector_base<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage,_std::allocator<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppJVar1 = *ppJVar1 + 1;
  }
  __mutex = local_80;
  *(int *)(local_58._M_p + 0xb8) = *(int *)(local_58._M_p + 0xb8) + 1;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._0_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_p != &local_68) {
    operator_delete(local_78._M_p,local_68._M_allocated_capacity + 1);
  }
  pthread_mutex_unlock(__mutex);
  return;
}

Assistant:

void test_case_exception(const TestCaseException& e) override {
            DOCTEST_LOCK_MUTEX(mutex)
            testCaseData.addError("exception", e.error_string.c_str());
        }